

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityAssertBits(_U_SINT mask,_U_SINT expected,_U_SINT actual,char *msg,_U_UINT lineNumber)

{
  _U_UINT lineNumber_local;
  char *msg_local;
  _U_SINT actual_local;
  _U_SINT expected_local;
  _U_SINT mask_local;
  
  if (((Unity.CurrentTestFailed == 0) && (Unity.CurrentTestIgnored == 0)) &&
     ((mask & expected) != (mask & actual))) {
    UnityTestResultsFailBegin(lineNumber);
    UnityPrint(" Expected ");
    UnityPrintMask(mask,expected);
    UnityPrint(" Was ");
    UnityPrintMask(mask,actual);
    UnityAddMsgIfSpecified(msg);
    Unity.CurrentTestFailed = 1;
    longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
  }
  return;
}

Assistant:

void UnityAssertBits(const _U_SINT mask,
                     const _U_SINT expected,
                     const _U_SINT actual,
                     const char* msg,
                     const UNITY_LINE_TYPE lineNumber)
{
    UNITY_SKIP_EXECUTION;

    if ((mask & expected) != (mask & actual))
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrint(UnityStrExpected);
        UnityPrintMask((_U_UINT)mask, (_U_UINT)expected);
        UnityPrint(UnityStrWas);
        UnityPrintMask((_U_UINT)mask, (_U_UINT)actual);
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }
}